

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkFormat * __thiscall
Fossilize::StateRecorder::Impl::copy<VkFormat>
          (Impl *this,VkFormat *src,size_t count,ScratchAllocator *alloc)

{
  VkFormat *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkFormat>(alloc,count);
    if (pVVar1 != (VkFormat *)0x0) {
      pVVar1 = (VkFormat *)memmove(pVVar1,src,count << 2);
      return pVVar1;
    }
  }
  return (VkFormat *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}